

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

int ON_FontList::CompareWeightStretchStyle(ON_Font **lhs,ON_Font **rhs)

{
  ON_Font *this;
  ON_Font *this_00;
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (((lhs != rhs) && (iVar2 = 1, lhs != (ON_Font **)0x0)) && (iVar2 = -1, rhs != (ON_Font **)0x0))
  {
    this = *lhs;
    this_00 = *rhs;
    iVar2 = 0;
    if (((this != this_00) && (iVar2 = 1, this != (ON_Font *)0x0)) &&
       ((iVar2 = -1, this_00 != (ON_Font *)0x0 &&
        ((iVar2 = (uint)this->m_font_style - (uint)this_00->m_font_style, iVar2 == 0 &&
         (iVar2 = (uint)this->m_font_stretch - (uint)this_00->m_font_stretch, iVar2 == 0)))))) {
      iVar2 = ON_Font::WindowsLogfontWeight(this);
      iVar1 = ON_Font::WindowsLogfontWeight(this_00);
      iVar2 = iVar2 - iVar1;
    }
  }
  return iVar2;
}

Assistant:

int ON_FontList::CompareWeightStretchStyle(
  ON_Font const* const* lhs, 
  ON_Font const* const* rhs
  )
{
  ON_ManagedFonts_CompareFontPointer(lhs, rhs);

  int rc;

  // Upright first, Italic 2nd, Oblique last

  // slope
  const int lhs_font_style = (int)static_cast<unsigned char>(lhs_font->FontStyle());
  const int rhs_font_style = (int)static_cast<unsigned char>(rhs_font->FontStyle());
  rc = (lhs_font_style - rhs_font_style);
  if (0 != rc)
    return rc;

  // width
  const int lhs_font_stretch = (int)static_cast<unsigned char>(lhs_font->FontStretch());
  const int rhs_font_stretch = (int)static_cast<unsigned char>(rhs_font->FontStretch());
  rc = (lhs_font_stretch - rhs_font_stretch);
  if (0 != rc)
    return rc;

  // weight
  const int lhs_font_weight = lhs_font->WindowsLogfontWeight();
  const int rhs_font_weight = rhs_font->WindowsLogfontWeight();
  rc = (lhs_font_weight - rhs_font_weight);
  if (0 != rc)
    return rc;

  return 0;
}